

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Track::Info::Info(Info *this)

{
  this->codecPrivate = (uchar *)0x0;
  this->codecPrivateSize = 0;
  this->codecId = (char *)0x0;
  this->codecNameAsUTF8 = (char *)0x0;
  this->nameAsUTF8 = (char *)0x0;
  this->language = (char *)0x0;
  this->codecDelay = 0;
  this->seekPreRoll = 0;
  this->uid = 0;
  this->defaultDuration = 0;
  this->lacing = false;
  return;
}

Assistant:

Track::Info::Info()
    : uid(0),
      defaultDuration(0),
      codecDelay(0),
      seekPreRoll(0),
      nameAsUTF8(NULL),
      language(NULL),
      codecId(NULL),
      codecNameAsUTF8(NULL),
      codecPrivate(NULL),
      codecPrivateSize(0),
      lacing(false) {}